

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

void UnitTest::_UnitTest_Compare::printFirst(void)

{
  char *pcVar1;
  ostream *poVar2;
  
  if ((global_unit_test_object_[0x20] & 1) == 0) {
    pcVar1 = _unittest_fail();
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
    std::operator<<(poVar2,anon_var_dwarf_26fc);
  }
  return;
}

Assistant:

static void printFirst() {  // {{{2
    if (!global_unit_test_object_.vim_lines) {
      std::cout << _unittest_fail() << "┍ ";
    }
  }